

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL> *
__thiscall
diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::
get_extra_required_extension_names_abi_cxx11_
          (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           *__return_storage_ptr__,ShaderSubgroupSupportHelper *this,Candidate c)

{
  char *pcVar1;
  char **arg_list_end;
  char *local_18;
  char *local_10;
  
  arg_list_end = (char **)&stack0xfffffffffffffff8;
  if ((int)this == 9) {
    local_18 = "GL_AMD_gpu_shader_int64";
    pcVar1 = "GL_NV_gpu_shader5";
  }
  else {
    if ((int)this != 7) {
      (__return_storage_ptr__->
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      (__return_storage_ptr__->
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).buffer_size = 0;
      (__return_storage_ptr__->
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &__return_storage_ptr__->stack_storage;
      __return_storage_ptr__->buffer_capacity = 8;
      return __return_storage_ptr__;
    }
    pcVar1 = "GL_ARB_shader_int64";
    arg_list_end = &local_10;
  }
  arg_list_end[-1] = pcVar1;
  SmallVector<std::__cxx11::string,8ul>::SmallVector<char_const*>
            ((SmallVector<std::__cxx11::string,8ul> *)__return_storage_ptr__,&local_18,arg_list_end)
  ;
  return __return_storage_ptr__;
}

Assistant:

SmallVector<std::string> CompilerGLSL::ShaderSubgroupSupportHelper::get_extra_required_extension_names(Candidate c)
{
	switch (c)
	{
	case ARB_shader_ballot:
		return { "GL_ARB_shader_int64" };
	case AMD_gcn_shader:
		return { "GL_AMD_gpu_shader_int64", "GL_NV_gpu_shader5" };
	default:
		return {};
	}
}